

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::translate
                   (char_t *buffer,char_t *from,char_t *to,size_t to_length)

{
  char_t c;
  char_t *pcVar1;
  char_t *pcVar2;
  char_t *pos;
  char_t *pcStack_30;
  char_t ch;
  char_t *write;
  size_t to_length_local;
  char_t *to_local;
  char_t *from_local;
  char_t *buffer_local;
  
  pcStack_30 = buffer;
  from_local = buffer;
  while (*from_local != '\0') {
    pcVar2 = from_local + 1;
    c = *from_local;
    pcVar1 = find_char(from,c);
    from_local = pcVar2;
    if (pcVar1 == (char_t *)0x0) {
      *pcStack_30 = c;
      pcStack_30 = pcStack_30 + 1;
    }
    else if ((ulong)((long)pcVar1 - (long)from) < to_length) {
      *pcStack_30 = to[(long)pcVar1 - (long)from];
      pcStack_30 = pcStack_30 + 1;
    }
  }
  *pcStack_30 = '\0';
  return pcStack_30;
}

Assistant:

PUGI_IMPL_FN char_t* translate(char_t* buffer, const char_t* from, const char_t* to, size_t to_length)
	{
		char_t* write = buffer;

		while (*buffer)
		{
			PUGI_IMPL_DMC_VOLATILE char_t ch = *buffer++;

			const char_t* pos = find_char(from, ch);

			if (!pos)
				*write++ = ch; // do not process
			else if (static_cast<size_t>(pos - from) < to_length)
				*write++ = to[pos - from]; // replace
		}

		// zero-terminate
		*write = 0;

		return write;
	}